

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_mkdtemp(uv_loop_t *loop,uv_fs_t *req,char *tpl,uv_fs_cb cb)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_MKDTEMP;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  pcVar4 = uv__strdup(tpl);
  req->path = pcVar4;
  if (pcVar4 == (char *)0x0) {
    iVar3 = -0xc;
    if (cb != (uv_fs_cb)0x0) {
      if (loop->active_reqs == (void **)loop->active_reqs[0]) {
        __assert_fail("uv__has_active_reqs(loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                      ,0x494,"int uv_fs_mkdtemp(uv_loop_t *, uv_fs_t *, const char *, uv_fs_cb)");
      }
      pvVar2 = req->active_queue[0];
      *(void **)req->active_queue[1] = pvVar2;
      *(void **)((long)pvVar2 + 8) = req->active_queue[1];
    }
  }
  else if (cb == (uv_fs_cb)0x0) {
    uv__fs_work(&req->work_req);
    iVar3 = (int)req->result;
  }
  else {
    uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int uv_fs_mkdtemp(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* tpl,
                  uv_fs_cb cb) {
  INIT(MKDTEMP);
  req->path = uv__strdup(tpl);
  if (req->path == NULL) {
    if (cb != NULL)
      uv__req_unregister(loop, req);
    return -ENOMEM;
  }
  POST;
}